

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loop_descriptor.cpp
# Opt level: O2

BasicBlock * __thiscall spvtools::opt::Loop::GetOrCreatePreHeaderBlock(Loop *this)

{
  CFG *this_00;
  BasicBlock *pBVar1;
  
  if (this->loop_preheader_ != (BasicBlock *)0x0) {
    return this->loop_preheader_;
  }
  this_00 = IRContext::cfg(this->context_);
  pBVar1 = CFG::SplitLoopHeader(this_00,this->loop_header_);
  this->loop_header_ = pBVar1;
  return this->loop_preheader_;
}

Assistant:

BasicBlock* Loop::GetOrCreatePreHeaderBlock() {
  if (loop_preheader_) return loop_preheader_;

  CFG* cfg = context_->cfg();
  loop_header_ = cfg->SplitLoopHeader(loop_header_);
  return loop_preheader_;
}